

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollableWindow.cpp
# Opt level: O1

bool __thiscall cursespp::ScrollableWindow::ProcessMouseEvent(ScrollableWindow *this,Event *event)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = Window::ProcessMouseEvent(&this->super_Window,event);
  uVar1 = event->state;
  if ((uVar1 & 4) == 0) {
    if ((uVar1 >> 0x15 & 1) == 0) {
      if ((uVar1 >> 0x10 & 1) == 0) {
        return bVar2;
      }
      (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3d])(this);
    }
    else {
      (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x3e])(this);
    }
  }
  else {
    Window::FocusInParent(&this->super_Window);
  }
  return true;
}

Assistant:

bool ScrollableWindow::ProcessMouseEvent(const IMouseHandler::Event& event) {
    const bool result = Window::ProcessMouseEvent(event);

    if (event.Button1Clicked()) {
        this->FocusInParent();
        return true;
    }
    else if (event.MouseWheelDown()) {
        this->PageDown();
        return true;
    }
    else if (event.MouseWheelUp()) {
        this->PageUp();
        return true;
    }

    return result;
}